

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_SwapLargeSmall_Test::
~RepeatedPtrFieldTest_SwapLargeSmall_Test(RepeatedPtrFieldTest_SwapLargeSmall_Test *this)

{
  RepeatedPtrFieldTest_SwapLargeSmall_Test *this_local;
  
  ~RepeatedPtrFieldTest_SwapLargeSmall_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, SwapLargeSmall) {
  RepeatedPtrField<std::string> field1;
  RepeatedPtrField<std::string> field2;

  field2.Add()->assign("foo");
  field2.Add()->assign("bar");
  for (int i = 0; i < 16; i++) {
    *field1.Add() += 'a' + i;
  }
  field1.Swap(&field2);

  EXPECT_EQ(field1.size(), 2);
  EXPECT_EQ(field1.Get(0), "foo");
  EXPECT_EQ(field1.Get(1), "bar");
  EXPECT_EQ(field2.size(), 16);
  for (int i = 0; i < 16; i++) {
    EXPECT_EQ(field2.Get(i).size(), 1);
    EXPECT_EQ(field2.Get(i)[0], 'a' + i);
  }
}